

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  size_t sVar1;
  StringPtr value;
  Reader decl;
  _Base_ptr p_Var2;
  ElementCount index;
  StringPtr importPath;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  Builder entry;
  undefined1 local_100 [16];
  CapTableBuilder *local_f0;
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  local_e8;
  Reader local_b8;
  undefined1 local_88 [40];
  void *pvStack_60;
  StructBuilder local_58;
  
  local_f0 = orphanage.capTable;
  local_100._8_8_ = orphanage.arena;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  capnp::_::OrphanGetImpl<capnp::compiler::ParsedFile,_(capnp::Kind)3>::applyReader
            (&local_b8,&(this->content).builder);
  ParsedFile::Reader::getRoot((Reader *)local_88,&local_b8);
  decl._reader.capTable = (CapTableReader *)local_88._8_8_;
  decl._reader.segment = (SegmentReader *)local_88._0_8_;
  decl._reader.data = (void *)local_88._16_8_;
  decl._reader.pointers = (WirePointer *)local_88._24_8_;
  decl._reader.dataSize = local_88._32_4_;
  decl._reader.pointerCount = local_88._36_2_;
  decl._reader._38_2_ = local_88._38_2_;
  decl._reader._40_8_ = pvStack_60;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   &local_e8);
  Orphanage::
  newOrphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,(capnp::Kind)3>>
            (__return_storage_ptr__,(Orphanage *)(local_100 + 8),
             (uint)local_e8._M_impl.super__Rb_tree_header._M_node_count);
  capnp::_::
  OrphanGetImpl<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&local_b8,&__return_storage_ptr__->builder);
  index = 0;
  p_Var2 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &local_e8._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
      ::~_Rb_tree(&local_e8);
      return __return_storage_ptr__;
    }
    sVar1 = *(size_t *)(p_Var2 + 1);
    value.content = *(ArrayPtr<const_char> *)(p_Var2 + 1);
    capnp::_::ListBuilder::getStructElement(&local_58,(ListBuilder *)&local_b8,index);
    importPath.content.size_ = sVar1;
    importPath.content.ptr = (char *)this;
    importRelative((CompiledModule *)local_100,importPath);
    if ((Impl *)local_100._0_8_ == (Impl *)0x0) break;
    *(size_t *)local_58.data = ((Arena *)(local_100._0_8_ + 0x168))->nextChunkSize;
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setName
              ((Builder *)&local_58,(Reader)value.content);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    index = index + 1;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x46f,FAILED,"importRelative(name) != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)local_100);
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}